

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_meshes.cpp
# Opt level: O0

void usage(char *argv0)

{
  ostream *poVar1;
  char *argv0_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,argv0);
  std::operator<<(poVar1," cylinder #slices #stacks output.obj\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,argv0);
  std::operator<<(poVar1," sphere   #slices #stacks output.obj\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,argv0);
  std::operator<<(poVar1," cone     #slices #stacks output.obj\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,argv0);
  std::operator<<(poVar1,
                  " torus    #slices_tube_circle #slices_cross_circle cross_radius output.obj\n");
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,argv0);
  std::operator<<(poVar1," cube     #slices_edge output.obj\n");
  std::operator<<((ostream *)&std::cerr,'\n');
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,argv0);
  std::operator<<(poVar1,
                  " normals          weights input.obj output.obj (weights must be either \'unweighted\' or \'angle_weighted\')\n"
                 );
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,argv0);
  std::operator<<(poVar1,
                  " normals_halfedge weights input.obj output.obj (weights must be either \'unweighted\' or \'angle_weighted\')\n"
                 );
  std::operator<<((ostream *)&std::cerr,'\n');
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,argv0);
  std::operator<<(poVar1," normalize input.obj output.obj\n");
  std::operator<<((ostream *)&std::cerr,'\n');
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,argv0);
  std::operator<<(poVar1,
                  " transform M11 M21 M31 M41 M12 M22 M32 M42 M13 M23 M33 M43 M14 M24 M34 M44 input.obj output.obj (Mij are the elements of a 4x4 matrix)\n"
                 );
  exit(-1);
}

Assistant:

void usage( const char* argv0 ) {
    std::cerr << "Usage: " << argv0 << " cylinder #slices #stacks output.obj\n";
    std::cerr << "Usage: " << argv0 << " sphere   #slices #stacks output.obj\n";
    std::cerr << "Usage: " << argv0 << " cone     #slices #stacks output.obj\n";
    std::cerr << "Usage: " << argv0 << " torus    #slices_tube_circle #slices_cross_circle cross_radius output.obj\n";
    std::cerr << "Usage: " << argv0 << " cube     #slices_edge output.obj\n";
    std::cerr << '\n';
    std::cerr << "Usage: " << argv0 << " normals          weights input.obj output.obj (weights must be either 'unweighted' or 'angle_weighted')\n";
    std::cerr << "Usage: " << argv0 << " normals_halfedge weights input.obj output.obj (weights must be either 'unweighted' or 'angle_weighted')\n";
    std::cerr << '\n';
    std::cerr << "Usage: " << argv0 << " normalize input.obj output.obj\n";
    std::cerr << '\n';
    std::cerr << "Usage: " << argv0 << " transform M11 M21 M31 M41 M12 M22 M32 M42 M13 M23 M33 M43 M14 M24 M34 M44 input.obj output.obj (Mij are the elements of a 4x4 matrix)\n";
    std::exit(-1);
}